

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function.cpp
# Opt level: O1

bool __thiscall
spvtools::val::Function::IsCompatibleWithExecutionModel
          (Function *this,ExecutionModel model,string *reason)

{
  char cVar1;
  ostream *poVar2;
  bool bVar3;
  list<std::function<bool_(spv::ExecutionModel,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*)>,_std::allocator<std::function<bool_(spv::ExecutionModel,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*)>_>_>
  *plVar4;
  _List_node_base *p_Var5;
  string message;
  stringstream ss_reason;
  ExecutionModel local_1e4;
  char *local_1e0;
  long local_1d8;
  char local_1d0;
  undefined7 uStack_1cf;
  char **local_1c0;
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  std::__cxx11::stringstream::stringstream(local_1b8);
  plVar4 = &this->execution_model_limitations_;
  bVar3 = true;
  p_Var5 = (_List_node_base *)plVar4;
  do {
    p_Var5 = (((_List_base<std::function<bool_(spv::ExecutionModel,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*)>,_std::allocator<std::function<bool_(spv::ExecutionModel,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*)>_>_>
                *)&p_Var5->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
    if (p_Var5 == (_List_node_base *)plVar4) break;
    local_1d8 = 0;
    local_1d0 = '\0';
    local_1c0 = &local_1e0;
    local_1e4 = model;
    local_1e0 = &local_1d0;
    if (p_Var5[2]._M_next == (_List_node_base *)0x0) {
      std::__throw_bad_function_call();
    }
    cVar1 = (*(code *)p_Var5[2]._M_prev)(p_Var5 + 1,&local_1e4,&local_1c0);
    if (reason != (string *)0x0 && cVar1 == '\0') {
      cVar1 = '\x01';
      if (local_1d8 != 0) {
        poVar2 = std::__ostream_insert<char,std::char_traits<char>>(local_1a8,local_1e0,local_1d8);
        std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
      }
      bVar3 = false;
    }
    if (local_1e0 != &local_1d0) {
      operator_delete(local_1e0,CONCAT71(uStack_1cf,local_1d0) + 1);
    }
  } while (cVar1 != '\0');
  if (p_Var5 == (_List_node_base *)plVar4) {
    if (reason == (string *)0x0 || bVar3 != false) goto LAB_006aa736;
    std::__cxx11::stringbuf::str();
    std::__cxx11::string::operator=((string *)reason,(string *)&local_1e0);
    if (local_1e0 != &local_1d0) {
      operator_delete(local_1e0,CONCAT71(uStack_1cf,local_1d0) + 1);
    }
  }
  bVar3 = false;
LAB_006aa736:
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(local_138);
  return bVar3;
}

Assistant:

bool Function::IsCompatibleWithExecutionModel(spv::ExecutionModel model,
                                              std::string* reason) const {
  bool return_value = true;
  std::stringstream ss_reason;

  for (const auto& is_compatible : execution_model_limitations_) {
    std::string message;
    if (!is_compatible(model, &message)) {
      if (!reason) return false;
      return_value = false;
      if (!message.empty()) {
        ss_reason << message << "\n";
      }
    }
  }

  if (!return_value && reason) {
    *reason = ss_reason.str();
  }

  return return_value;
}